

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O0

ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
* __thiscall
memory::
ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
::operator=(ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *__return_storage_ptr__,
           ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
           *this,ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *other)

{
  size_type sVar1;
  size_type sVar2;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *other_local;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *this_local;
  
  sVar1 = ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::size(&other->
                  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                );
  sVar2 = ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::size((ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                  *)this);
  if (sVar1 == sVar2) {
    HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>::
    copy<memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>
              ((HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>> *
               )this,&other->
                      super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
               ,(ArrayView<value_type,_HostCoordinator<value_type,_Allocator<double,_AlignedPolicy<8UL>_>_>_>
                 *)this);
    *(undefined8 *)
     &__return_storage_ptr__->
      super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
         = *(undefined8 *)this;
    (__return_storage_ptr__->
    super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
    ).pointer_ = *(pointer *)(this + 8);
    (__return_storage_ptr__->
    super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
    ).size_ = *(size_type *)(this + 0x10);
    return __return_storage_ptr__;
  }
  __assert_fail("other.size() == this->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                ,0x2c5,
                "ArrayReference<T, Coord> memory::ArrayReference<double, memory::HostCoordinator<double>>::operator=(Other &&) [T = double, Coord = memory::HostCoordinator<double>, Other = memory::ArrayReference<double, memory::HostCoordinator<double>> &]"
               );
}

Assistant:

ArrayReference operator = (Other&& other) {
#ifndef NDEBUG
        assert(other.size() == this->size());
#endif
#ifdef VERBOSE
        std::cerr << util::type_printer<ArrayReference>::print()
                  << "::" << util::blue("operator=") << "(&&"
                  << util::type_printer<typename std::decay<Other>::type>::print()
                  << ")" << std::endl;
#endif
        base::coordinator_.copy(other, *this);

        return *this;
    }